

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.cpp
# Opt level: O0

QMetaType QMetaType::fromName(QByteArrayView typeName)

{
  QMetaType *this;
  long in_FS_OFFSET;
  int in_stack_0000000c;
  char *in_stack_00000010;
  QByteArrayView *this_00;
  int typeId;
  QByteArrayView local_20;
  QMetaTypeInterface *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &local_20;
  this = (QMetaType *)QByteArrayView::data(this_00);
  QByteArrayView::size(this_00);
  typeId = (int)((ulong)this_00 >> 0x20);
  qMetaTypeTypeImpl<((anonymous_namespace)::NormalizeTypeMode)1>
            (in_stack_00000010,in_stack_0000000c);
  QMetaType(this,typeId);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QMetaType)local_10;
  }
  __stack_chk_fail();
}

Assistant:

QMetaType QMetaType::fromName(QByteArrayView typeName)
{
    return QMetaType(qMetaTypeTypeImpl<TryNormalizeType>(typeName.data(), typeName.size()));
}